

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O1

void __thiscall Fl_Text_Buffer::~Fl_Text_Buffer(Fl_Text_Buffer *this)

{
  free(this->mBuf);
  if (this->mNModifyProcs != 0) {
    if (this->mModifyProcs != (Fl_Text_Modify_Cb *)0x0) {
      operator_delete__(this->mModifyProcs);
    }
    if (this->mCbArgs != (void **)0x0) {
      operator_delete__(this->mCbArgs);
    }
  }
  if (0 < this->mNPredeleteProcs) {
    if (this->mPredeleteProcs != (Fl_Text_Predelete_Cb *)0x0) {
      operator_delete__(this->mPredeleteProcs);
    }
    if (this->mPredeleteCbArgs != (void **)0x0) {
      operator_delete__(this->mPredeleteCbArgs);
      return;
    }
  }
  return;
}

Assistant:

Fl_Text_Buffer::~Fl_Text_Buffer()
{
  free(mBuf);
  if (mNModifyProcs != 0) {
    delete[]mModifyProcs;
    delete[]mCbArgs;
  }
  if (mNPredeleteProcs > 0) {
    delete[] mPredeleteProcs;
    delete[] mPredeleteCbArgs;
  }
}